

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

nghttp2_settings_entry *
nghttp2_frame_iv_copy(nghttp2_settings_entry *iv,size_t niv,nghttp2_mem *mem)

{
  void *__dest;
  nghttp2_settings_entry *pnVar1;
  size_t size;
  
  size = niv << 3;
  if (size != 0) {
    __dest = nghttp2_mem_malloc(mem,size);
    if (__dest != (void *)0x0) {
      pnVar1 = (nghttp2_settings_entry *)memcpy(__dest,iv,size);
      return pnVar1;
    }
  }
  return (nghttp2_settings_entry *)0x0;
}

Assistant:

nghttp2_settings_entry *nghttp2_frame_iv_copy(const nghttp2_settings_entry *iv,
                                              size_t niv, nghttp2_mem *mem) {
  nghttp2_settings_entry *iv_copy;
  size_t len = niv * sizeof(nghttp2_settings_entry);

  if (len == 0) {
    return NULL;
  }

  iv_copy = nghttp2_mem_malloc(mem, len);

  if (iv_copy == NULL) {
    return NULL;
  }

  memcpy(iv_copy, iv, len);

  return iv_copy;
}